

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

optional<pbrt::ShapeSample> * __thiscall pbrt::Sphere::Sample(Sphere *this,Point2f *u)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Sphere *in_RSI;
  optional<pbrt::ShapeSample> *in_RDI;
  type tVar4;
  Float FVar5;
  undefined1 auVar7 [16];
  undefined8 uVar13;
  undefined1 auVar14 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  Vector3f VVar15;
  Vector3<float> VVar16;
  Point3<float> PVar17;
  Normal3<float> NVar18;
  Point3fi pi;
  Normal3f n;
  Vector3f pObjError;
  Point3f pObj;
  Point3fi *in_stack_00000268;
  Transform *in_stack_00000270;
  float in_stack_fffffffffffffda8;
  float in_stack_fffffffffffffdac;
  Normal3<float> *in_stack_fffffffffffffdb0;
  Transform *this_00;
  Vector3<float> *in_stack_fffffffffffffdb8;
  Float time;
  optional<pbrt::ShapeSample> *t;
  undefined4 in_stack_fffffffffffffdd0;
  undefined1 local_1a8 [80];
  float local_158;
  Normal3<float> *in_stack_fffffffffffffeb8;
  Transform *in_stack_fffffffffffffec0;
  undefined8 local_e4;
  float local_dc;
  undefined8 local_d8;
  float local_d0;
  undefined8 local_c8;
  float local_c0;
  undefined8 local_a8;
  float local_a0;
  undefined8 local_98;
  float local_90;
  undefined8 local_80;
  float local_78;
  undefined8 local_70;
  float local_68;
  undefined8 local_60;
  float local_58;
  undefined8 local_50;
  float local_48;
  undefined8 local_40;
  float local_38;
  undefined8 local_28;
  float local_20;
  double dVar6;
  
  t = in_RDI;
  Point3<float>::Point3
            ((Point3<float> *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,
             in_stack_fffffffffffffda8,0.0);
  FVar5 = in_RSI->radius;
  uVar13 = 0;
  VVar15 = SampleUniformSphere((Point2f *)CONCAT44(FVar5,in_stack_fffffffffffffdd0));
  local_58 = VVar15.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar14 = (undefined1  [56])0x0;
  auVar2._8_8_ = uVar13;
  auVar2._0_8_ = VVar15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_60 = vmovlpd_avx(auVar2);
  local_50 = local_60;
  local_48 = local_58;
  VVar16 = pbrt::operator*(FVar5,(Tuple3<pbrt::Vector3,_float> *)t);
  local_68 = VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar8._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar8._8_56_ = auVar14;
  local_70 = vmovlpd_avx(auVar8._0_16_);
  local_40 = local_70;
  local_38 = local_68;
  PVar17 = Point3<float>::operator+((Point3<float> *)in_RDI,in_stack_fffffffffffffdb8);
  local_78 = PVar17.super_Tuple3<pbrt::Point3,_float>.z;
  auVar9._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar9._8_56_ = auVar14;
  local_80 = vmovlpd_avx(auVar9._0_16_);
  fVar1 = in_RSI->radius;
  local_28 = local_80;
  local_20 = local_78;
  Point3<float>::Point3
            ((Point3<float> *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,
             in_stack_fffffffffffffda8,0.0);
  tVar4 = Distance<float>((Point3<float> *)CONCAT44(FVar5,in_stack_fffffffffffffdd0),
                          (Point3<float> *)t);
  auVar7._0_4_ = fVar1 / tVar4;
  auVar7._4_12_ = SUB6012((undefined1  [60])0x0,0);
  dVar6 = auVar7._0_8_;
  Tuple3<pbrt::Point3,float>::operator*=((Tuple3<pbrt::Point3,float> *)&local_28,auVar7._0_4_);
  pbrt::gamma(dVar6);
  uVar13 = extraout_XMM0_Qb;
  Vector3<float>::Vector3<float>
            ((Vector3<float> *)in_stack_fffffffffffffdb0,
             (Point3<float> *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  VVar16 = Abs<pbrt::Vector3,float>((Tuple3<pbrt::Vector3,_float> *)in_RDI);
  local_c0 = VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar14 = (undefined1  [56])0x0;
  auVar3._8_8_ = uVar13;
  auVar3._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_c8 = vmovlpd_avx(auVar3);
  local_a8 = local_c8;
  local_a0 = local_c0;
  VVar16 = pbrt::operator*(FVar5,(Tuple3<pbrt::Vector3,_float> *)t);
  local_d0 = VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar10._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar10._8_56_ = auVar14;
  local_d8 = vmovlpd_avx(auVar10._0_16_);
  auVar14 = (undefined1  [56])0x0;
  local_98 = local_d8;
  local_90 = local_d0;
  Normal3<float>::Normal3
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,in_stack_fffffffffffffda8,0.0);
  NVar18 = Transform::operator()(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  auVar11._0_8_ = NVar18.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar11._8_56_ = auVar14;
  vmovlpd_avx(auVar11._0_16_);
  NVar18 = Normalize<float>((Normal3<float> *)CONCAT44(FVar5,in_stack_fffffffffffffdd0));
  local_dc = NVar18.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar12._0_8_ = NVar18.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar12._8_56_ = auVar14;
  local_e4 = vmovlpd_avx(auVar12._0_16_);
  if ((in_RSI->reverseOrientation & 1U) != 0) {
    Tuple3<pbrt::Normal3,float>::operator*=((Tuple3<pbrt::Normal3,float> *)&local_e4,-1);
  }
  this_00 = in_RSI->renderFromObject;
  Point3fi::Point3fi((Point3fi *)CONCAT44(FVar5,in_stack_fffffffffffffdd0),(Point3f *)t,
                     (Vector3f *)in_RDI);
  Transform::operator()(in_stack_00000270,in_stack_00000268);
  time = (Float)((ulong)local_1a8 >> 0x20);
  Point2<float>::Point2((Point2<float> *)this_00);
  Interaction::Interaction
            ((Interaction *)CONCAT44(FVar5,in_stack_fffffffffffffdd0),(Point3fi *)t,
             (Normal3f *)in_RDI,time,(Point2f *)this_00);
  FVar5 = Area(in_RSI);
  local_158 = 1.0 / FVar5;
  pstd::optional<pbrt::ShapeSample>::optional
            ((optional<pbrt::ShapeSample> *)this_00,
             (ShapeSample *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  return t;
}

Assistant:

pstd::optional<ShapeSample> Sphere::Sample(const Point2f &u) const {
    Point3f pObj = Point3f(0, 0, 0) + radius * SampleUniformSphere(u);
    // Reproject _pObj_ to sphere surface and compute _pObjError_
    pObj *= radius / Distance(pObj, Point3f(0, 0, 0));
    Vector3f pObjError = gamma(5) * Abs((Vector3f)pObj);

    // Compute surface normal for sphere sample and return _ShapeSample_
    Normal3f n = Normalize((*renderFromObject)(Normal3f(pObj.x, pObj.y, pObj.z)));
    if (reverseOrientation)
        n *= -1;
    Point3fi pi = (*renderFromObject)(Point3fi(pObj, pObjError));
    return ShapeSample{Interaction(pi, n), 1 / Area()};
}